

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O1

UText * utext_setup_63(UText *ut,int32_t extraSpace,UErrorCode *status)

{
  uint uVar1;
  UTextClose *pUVar2;
  void *pvVar3;
  int iVar4;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (ut == (UText *)0x0) {
      iVar4 = extraSpace + 0x90;
      if (extraSpace < 1) {
        iVar4 = 0x90;
      }
      ut = (UText *)uprv_malloc_63((long)iVar4);
      if (ut == (UText *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        memcpy(ut,&emptyText,0x90);
        *(byte *)&ut->flags = (byte)ut->flags | 1;
        if (0 < iVar4) {
          ut->extraSize = extraSpace;
          ut->pExtra = ut + 1;
        }
      }
      if (ut == (UText *)0x0) {
        return (UText *)0x0;
      }
    }
    else {
      if (ut->magic != 0x345ad82c) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return ut;
      }
      if (((ut->flags & 4) != 0) && (pUVar2 = ut->pFuncs->close, pUVar2 != (UTextClose *)0x0)) {
        (*pUVar2)(ut);
      }
      uVar1 = ut->flags;
      ut->flags = uVar1 & 0xfffffffb;
      if (ut->extraSize < extraSpace) {
        if ((uVar1 & 2) != 0) {
          uprv_free_63(ut->pExtra);
          ut->extraSize = 0;
        }
        pvVar3 = uprv_malloc_63((long)extraSpace);
        ut->pExtra = pvVar3;
        if (pvVar3 == (void *)0x0) {
          *status = U_MEMORY_ALLOCATION_ERROR;
        }
        else {
          ut->extraSize = extraSpace;
          *(byte *)&ut->flags = (byte)ut->flags | 2;
        }
      }
    }
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      *(byte *)&ut->flags = (byte)ut->flags | 4;
      ut->chunkNativeLimit = 0;
      ut->providerProperties = 0;
      *(undefined8 *)&ut->nativeIndexingLimit = 0;
      *(undefined8 *)((long)&ut->chunkNativeStart + 4) = 0;
      ut->chunkOffset = 0;
      ut->chunkLength = 0;
      ut->chunkContents = (UChar *)0x0;
      ut->context = (void *)0x0;
      ut->p = (void *)0x0;
      ut->q = (void *)0x0;
      ut->r = (void *)0x0;
      ut->privP = (void *)0x0;
      ut->a = 0;
      ut->b = 0;
      ut->c = 0;
      ut->privA = 0;
      ut->privB = 0;
      ut->privC = 0;
      if ((ut->pExtra != (void *)0x0) && (0 < (long)ut->extraSize)) {
        memset(ut->pExtra,0,(long)ut->extraSize);
      }
    }
  }
  return ut;
}

Assistant:

U_CAPI UText * U_EXPORT2
utext_setup(UText *ut, int32_t extraSpace, UErrorCode *status) {
    if (U_FAILURE(*status)) {
        return ut;
    }

    if (ut == NULL) {
        // We need to heap-allocate storage for the new UText
        int32_t spaceRequired = sizeof(UText);
        if (extraSpace > 0) {
            spaceRequired = sizeof(ExtendedUText) + extraSpace - sizeof(UAlignedMemory);
        }
        ut = (UText *)uprv_malloc(spaceRequired);
        if (ut == NULL) {
            *status = U_MEMORY_ALLOCATION_ERROR;
            return NULL;
        } else {
            *ut = emptyText;
            ut->flags |= UTEXT_HEAP_ALLOCATED;
            if (spaceRequired>0) {
                ut->extraSize = extraSpace;
                ut->pExtra    = &((ExtendedUText *)ut)->extension;
            }
        }
    } else {
        // We have been supplied with an already existing UText.
        // Verify that it really appears to be a UText.
        if (ut->magic != UTEXT_MAGIC) {
            *status = U_ILLEGAL_ARGUMENT_ERROR;
            return ut;
        }
        // If the ut is already open and there's a provider supplied close
        //   function, call it.
        if ((ut->flags & UTEXT_OPEN) && ut->pFuncs->close != NULL)  {
            ut->pFuncs->close(ut);
        }
        ut->flags &= ~UTEXT_OPEN;

        // If extra space was requested by our caller, check whether
        //   sufficient already exists, and allocate new if needed.
        if (extraSpace > ut->extraSize) {
            // Need more space.  If there is existing separately allocated space,
            //   delete it first, then allocate new space.
            if (ut->flags & UTEXT_EXTRA_HEAP_ALLOCATED) {
                uprv_free(ut->pExtra);
                ut->extraSize = 0;
            }
            ut->pExtra = uprv_malloc(extraSpace);
            if (ut->pExtra == NULL) {
                *status = U_MEMORY_ALLOCATION_ERROR;
            } else {
                ut->extraSize = extraSpace;
                ut->flags |= UTEXT_EXTRA_HEAP_ALLOCATED;
            }
        }
    }
    if (U_SUCCESS(*status)) {
        ut->flags |= UTEXT_OPEN;

        // Initialize all remaining fields of the UText.
        //
        ut->context             = NULL;
        ut->chunkContents       = NULL;
        ut->p                   = NULL;
        ut->q                   = NULL;
        ut->r                   = NULL;
        ut->a                   = 0;
        ut->b                   = 0;
        ut->c                   = 0;
        ut->chunkOffset         = 0;
        ut->chunkLength         = 0;
        ut->chunkNativeStart    = 0;
        ut->chunkNativeLimit    = 0;
        ut->nativeIndexingLimit = 0;
        ut->providerProperties  = 0;
        ut->privA               = 0;
        ut->privB               = 0;
        ut->privC               = 0;
        ut->privP               = NULL;
        if (ut->pExtra!=NULL && ut->extraSize>0)
            uprv_memset(ut->pExtra, 0, ut->extraSize);

    }
    return ut;
}